

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unknown_field_set.cc
# Opt level: O1

uint8 * __thiscall
google::protobuf::UnknownField::InternalSerializeLengthDelimitedNoTag
          (UnknownField *this,uint8 *target,EpsCopyOutputStream *stream)

{
  UnknownFieldSet *pUVar1;
  pointer pUVar2;
  int size;
  uint uVar3;
  uint uVar4;
  ulong uVar5;
  uint8 *puVar6;
  uint8 *puVar7;
  size_t __n;
  
  pUVar1 = (this->data_).group_;
  pUVar2 = (pUVar1->fields_).
           super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if ((uint)pUVar2 < 0x80) {
    *target = (byte)pUVar2;
    puVar6 = target + 1;
  }
  else {
    *target = (byte)pUVar2 | 0x80;
    uVar5 = (ulong)pUVar2 >> 7 & 0x1ffffff;
    if ((uint)pUVar2 < 0x4000) {
      target[1] = (uint8)uVar5;
      puVar6 = target + 2;
    }
    else {
      puVar6 = target + 2;
      do {
        puVar7 = puVar6;
        uVar3 = (uint)uVar5;
        puVar7[-1] = (byte)uVar5 | 0x80;
        uVar4 = uVar3 >> 7;
        uVar5 = (ulong)uVar4;
        puVar6 = puVar7 + 1;
      } while (0x3fff < uVar3);
      *puVar7 = (uint8)uVar4;
    }
  }
  pUVar2 = (pUVar1->fields_).
           super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
           ._M_impl.super__Vector_impl_data._M_start;
  size = (int)(pUVar1->fields_).
              super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
              ._M_impl.super__Vector_impl_data._M_finish;
  __n = (size_t)size;
  if ((long)__n <= (long)stream->end_ - (long)puVar6) {
    memcpy(puVar6,pUVar2,__n);
    return puVar6 + __n;
  }
  puVar6 = io::EpsCopyOutputStream::WriteRawFallback(stream,pUVar2,size,puVar6);
  return puVar6;
}

Assistant:

uint8* UnknownField::InternalSerializeLengthDelimitedNoTag(
    uint8* target, io::EpsCopyOutputStream* stream) const {
  GOOGLE_DCHECK_EQ(TYPE_LENGTH_DELIMITED, type());
  const std::string& data = *data_.length_delimited_.string_value;
  target = io::CodedOutputStream::WriteVarint32ToArray(data.size(), target);
  target = stream->WriteRaw(data.data(), data.size(), target);
  return target;
}